

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O2

void __thiscall
zstr::detail::z_stream_wrapper::z_stream_wrapper
          (z_stream_wrapper *this,bool _is_input,int _level,int _window_bits)

{
  int iVar1;
  Exception *this_00;
  undefined7 in_register_00000031;
  
  this->is_input = _is_input;
  (this->super_z_stream).zalloc = (alloc_func)0x0;
  (this->super_z_stream).zfree = (free_func)0x0;
  (this->super_z_stream).opaque = (voidpf)0x0;
  if ((int)CONCAT71(in_register_00000031,_is_input) == 0) {
    iVar1 = 0x1f;
    if (_window_bits != 0) {
      iVar1 = _window_bits;
    }
    iVar1 = deflateInit2_(this,_level,8,iVar1,8,0,"1.2.11");
  }
  else {
    (this->super_z_stream).avail_in = 0;
    (this->super_z_stream).next_in = (Bytef *)0x0;
    iVar1 = 0x2f;
    if (_window_bits != 0) {
      iVar1 = _window_bits;
    }
    iVar1 = inflateInit2_(this,iVar1,"1.2.11",0x70);
  }
  if (iVar1 == 0) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x20);
  Exception::Exception(this_00,&this->super_z_stream,iVar1);
  __cxa_throw(this_00,&Exception::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

z_stream_wrapper(bool _is_input, int _level, int _window_bits)
      : is_input(_is_input) {
    this->zalloc = nullptr;  // Z_NULL
    this->zfree = nullptr;   // Z_NULL
    this->opaque = nullptr;  // Z_NULL
    int ret;
    if (is_input) {
      this->avail_in = 0;
      this->next_in = nullptr;  // Z_NULL
      ret = inflateInit2(this, _window_bits ? _window_bits : 15 + 32);
    } else {
      ret = deflateInit2(this, _level, Z_DEFLATED,
                         _window_bits ? _window_bits : 15 + 16, 8,
                         Z_DEFAULT_STRATEGY);
    }
    if (ret != Z_OK) throw Exception(this, ret);
  }